

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslationalOrderParamZ.cpp
# Opt level: O2

void __thiscall OpenMD::TranslationalOrderParamZ::processHistogram(TranslationalOrderParamZ *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  pointer piVar4;
  pointer pvVar5;
  long lVar6;
  pointer pvVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  RealType RVar12;
  double dVar13;
  double dVar14;
  
  iVar1 = (this->super_RadialDistrFunc).nPairs_;
  RVar12 = Snapshot::getVolume(((this->super_RadialDistrFunc).super_StaticAnalyser.info_)->sman_->
                               currentSnapshot_);
  pvVar7 = (this->histogram_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar10 = 0; uVar11 = (ulong)uVar10,
      uVar11 < (ulong)(((long)(this->histogram_).
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7) / 0x18);
      uVar10 = uVar10 + 1) {
    dVar14 = (double)uVar11 * this->deltaR_;
    dVar13 = pow(this->deltaR_ + dVar14,3.0);
    dVar14 = pow(dVar14,3.0);
    iVar2 = this->nZBins_;
    pvVar7 = (this->histogram_).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar3 = *(long *)&pvVar7[uVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data;
    piVar4 = *(pointer *)
              ((long)&pvVar7[uVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data + 8);
    pvVar5 = (this->avgGofr_).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (uVar8 = 0; uVar9 = (ulong)uVar8, uVar9 < (ulong)((long)piVar4 - lVar3 >> 2);
        uVar8 = uVar8 + 1) {
      lVar6 = *(long *)&pvVar5[uVar11].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      *(double *)(lVar6 + uVar9 * 8) =
           (double)*(int *)(lVar3 + uVar9 * 4) /
           (((((dVar13 - dVar14) * 12.566370614359172) / 3.0) * ((double)(iVar1 * 2) / RVar12)) /
           (double)iVar2) + *(double *)(lVar6 + uVar9 * 8);
    }
  }
  return;
}

Assistant:

void TranslationalOrderParamZ::processHistogram() {
    int nPairs = getNPairs();
    RealType volume =
        info_->getSnapshotManager()->getCurrentSnapshot()->getVolume();
    RealType pairDensity = 2 * nPairs / volume;

    for (unsigned int i = 0; i < histogram_.size(); ++i) {
      RealType rLower = i * deltaR_;
      RealType rUpper = rLower + deltaR_;
      RealType volSlice =
          4.0 * Constants::PI * (pow(rUpper, 3) - pow(rLower, 3)) / 3.0;
      RealType nIdeal = volSlice * pairDensity / nZBins_;

      for (unsigned int j = 0; j < histogram_[i].size(); ++j) {
        avgGofr_[i][j] += histogram_[i][j] / nIdeal;
      }
    }
  }